

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Bool CleanTrailingWhitespace(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  Bool BVar1;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = prvTidynodeIsText(node);
  if (BVar1 == no) {
    doc_local._4_4_ = no;
  }
  else if (node->parent->type == DocTypeTag) {
    doc_local._4_4_ = no;
  }
  else {
    BVar1 = IsPreDescendant(node);
    if (BVar1 == no) {
      if ((node->parent->tag == (Dict *)0x0) || (node->parent->tag->parser != prvTidyParseScript)) {
        if (((node->next == (Node *)0x0) ||
            ((((node->next == (Node *)0x0 || (node->next->tag == (Dict *)0x0)) ||
              (node->next->tag->id != TidyTag_SCRIPT)) ||
             ((node->next->parent == (Node *)0x0 || (node->next->parent->tag == (Dict *)0x0)))))) ||
           (node->next->parent->tag->id != TidyTag_BODY)) {
          node_00 = node->next;
          if ((node_00 == (Node *)0x0) && (BVar1 = prvTidynodeHasCM(node->parent,0x10), BVar1 == no)
             ) {
            return yes;
          }
          if (((node_00 == (Node *)0x0) && (node->parent->next != (Node *)0x0)) &&
             (BVar1 = prvTidynodeHasCM(node->parent->next,0x10), BVar1 == no)) {
            return yes;
          }
          if (node_00 == (Node *)0x0) {
            doc_local._4_4_ = no;
          }
          else if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
                  (node_00->tag->id != TidyTag_BR)) {
            BVar1 = prvTidynodeHasCM(node_00,0x10);
            if (BVar1 == no) {
              if (node_00->type == StartTag) {
                doc_local._4_4_ = yes;
              }
              else if (node_00->type == StartEndTag) {
                doc_local._4_4_ = yes;
              }
              else {
                BVar1 = prvTidynodeIsText(node_00);
                if (((BVar1 != no) && (node_00->start < node_00->end)) &&
                   (BVar1 = prvTidyIsWhite((int)doc->lexer->lexbuf[node_00->start]), BVar1 != no)) {
                  return yes;
                }
                doc_local._4_4_ = no;
              }
            }
            else {
              doc_local._4_4_ = no;
            }
          }
          else {
            doc_local._4_4_ = yes;
          }
        }
        else {
          doc_local._4_4_ = yes;
        }
      }
      else {
        doc_local._4_4_ = no;
      }
    }
    else {
      doc_local._4_4_ = no;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static Bool CleanTrailingWhitespace(TidyDocImpl* doc, Node* node)
{
    Node* next;

    if (!TY_(nodeIsText)(node))
        return no;

    if (node->parent->type == DocTypeTag)
        return no;

    if (IsPreDescendant(node))
        return no;

    if (node->parent->tag && node->parent->tag->parser == TY_(ParseScript))
        return no;

    /* #523, prevent blank spaces after script if the next item is script.
     * This is actually more generalized as, if the next element is
     * a body level script, then indicate that we want to clean trailing
     * whitespace.
     */
    if ( node->next && nodeIsSCRIPT(node->next) && nodeIsBODY(node->next->parent) )
        return yes;

    next = node->next;

    /* <p>... </p> */
    if (!next && !TY_(nodeHasCM)(node->parent, CM_INLINE))
        return yes;

    /* <div><small>... </small><h3>...</h3></div> */
    if (!next && node->parent->next && !TY_(nodeHasCM)(node->parent->next, CM_INLINE))
        return yes;

    if (!next)
        return no;

    if (nodeIsBR(next))
        return yes;

    if (TY_(nodeHasCM)(next, CM_INLINE))
        return no;

    /* <a href='/'>...</a> <p>...</p> */
    if (next->type == StartTag)
        return yes;

    /* <strong>...</strong> <hr /> */
    if (next->type == StartEndTag)
        return yes;

    /* evil adjacent text nodes, Tidy should not generate these :-( */
    if (TY_(nodeIsText)(next) && next->start < next->end
        && TY_(IsWhite)(doc->lexer->lexbuf[next->start]))
        return yes;

    return no;
}